

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ResetStream
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,
          TokenStream<SGParser::Generator::RegExprParseToken> *psourceStream,size_t rememberLength)

{
  StreamBlock *pSVar1;
  
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>,_std::_Select1st<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
  ::clear(&(this->Markers)._M_t);
  while( true ) {
    pSVar1 = this->pFirstBlock;
    if (pSVar1->pNext == (StreamBlock *)0x0) break;
    this->pFirstBlock = pSVar1->pNext;
    if (pSVar1 != (StreamBlock *)0x0) {
      operator_delete(pSVar1,0x1018);
    }
  }
  this->pThisBlock = pSVar1;
  pSVar1->Index = 0;
  this->ThisPos = 0;
  this->pSourceStream = psourceStream;
  this->RememberLength = rememberLength;
  this->LengthLeft =
       -(ulong)(psourceStream != (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0);
  this->Pos = 0;
  this->SourceEOFFlag = false;
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ResetStream(TokenStream<Token>* psourceStream,
                                                 size_t rememberLength) noexcept {
    // Release all markers
    Markers.clear();
    // Release all but one buffer
    while (pFirstBlock->pNext)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);

    pThisBlock        = pFirstBlock;
    pThisBlock->Index = 0u;
    ThisPos           = 0u;
    // Reset variables
    pSourceStream     = psourceStream;
    RememberLength    = rememberLength;
    LengthLeft        = psourceStream ? MaxSize : 0u;
    Pos               = 0u;
    SourceEOFFlag     = false;
}